

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeCallQueue.cpp
# Opt level: O0

CallReader * xe::operator>>(CallReader *reader,string *value)

{
  size_t in_RCX;
  char local_19;
  string *psStack_18;
  char c;
  string *value_local;
  CallReader *reader_local;
  
  psStack_18 = value;
  value_local = (string *)reader;
  std::__cxx11::string::clear();
  while( true ) {
    CallReader::read((CallReader *)value_local,(int)&local_19,(void *)0x1,in_RCX);
    if (local_19 == '\0') break;
    std::__cxx11::string::push_back((char)psStack_18);
  }
  return (CallReader *)value_local;
}

Assistant:

CallReader& operator>> (CallReader& reader, std::string& value)
{
	value.clear();
	for (;;)
	{
		char c;
		reader.read((deUint8*)&c, sizeof(char));
		if (c != 0)
			value.push_back(c);
		else
			break;
	}

	return reader;
}